

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_tools.cxx
# Opt level: O0

void __thiscall dds_tools::process_file(dds_tools *this,string *path)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 uVar5;
  xr_file_system *this_00;
  undefined1 local_180 [8];
  xr_image dds;
  string dds_path;
  string folder;
  string dest;
  string tga_path;
  xr_file_system *fs;
  undefined1 local_d0 [8];
  xr_texture_thumbnail thm;
  size_type offs;
  string *path_local;
  dds_tools *this_local;
  
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 4) {
    return;
  }
  thm.ext_normal_map_name.field_2._8_8_ = uVar3 - 4;
  iVar2 = std::__cxx11::string::compare
                    ((ulong)path,thm.ext_normal_map_name.field_2._8_8_,(char *)0x4);
  if (iVar2 != 0) {
    return;
  }
  xray_re::xr_texture_thumbnail::xr_texture_thumbnail((xr_texture_thumbnail *)local_d0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = xray_re::xr_texture_thumbnail::load
                    ((xr_texture_thumbnail *)local_d0,"$game_textures$",pcVar4);
  if (!bVar1) {
    uVar5 = std::__cxx11::string::c_str();
    xray_re::msg("can\'t load %s",uVar5);
    goto LAB_00126649;
  }
  iVar2 = std::__cxx11::string::compare((ulong)path,0,(char *)0x4);
  if (iVar2 == 0) {
    uVar5 = std::__cxx11::string::c_str();
    xray_re::msg("skipping %s (billboard)",uVar5);
    goto LAB_00126649;
  }
  switch(thm.detail_name.field_2._12_4_) {
  case 0:
    if ((((this->m_with_solid & 1U) == 0) &&
        (bVar1 = xray_re::xr_texture_thumbnail::has_alpha_channel((xr_texture_thumbnail *)local_d0),
        !bVar1)) &&
       (bVar1 = xray_re::xr_texture_thumbnail::is_implicitly_lighted
                          ((xr_texture_thumbnail *)local_d0), !bVar1)) {
      uVar5 = std::__cxx11::string::c_str();
      xray_re::msg("skipping %s (solid)",uVar5);
      goto LAB_00126649;
    }
    break;
  case 1:
    uVar5 = std::__cxx11::string::c_str();
    xray_re::msg("skipping %s (cube map)",uVar5);
    goto LAB_00126649;
  case 2:
    if ((this->m_with_bump & 1U) == 0) {
      uVar5 = std::__cxx11::string::c_str();
      xray_re::msg("skipping %s (bump map)",uVar5);
      goto LAB_00126649;
    }
    break;
  case 3:
  case 4:
    break;
  default:
    uVar5 = std::__cxx11::string::c_str();
    xray_re::msg("skipping %s (unknown) %#x",uVar5,(ulong)(uint)thm.detail_name.field_2._12_4_);
    goto LAB_00126649;
  }
  this_00 = xray_re::xr_file_system::instance();
  std::__cxx11::string::string((string *)(dest.field_2._M_local_buf + 8),(string *)path);
  std::__cxx11::string::replace
            ((ulong)((long)&dest.field_2 + 8),thm.ext_normal_map_name.field_2._8_8_,(char *)0x4);
  std::__cxx11::string::string((string *)(folder.field_2._M_local_buf + 8));
  xray_re::xr_file_system::resolve_path
            (this_00,"$textures$",(string *)((long)&dest.field_2 + 8),
             (string *)(folder.field_2._M_local_buf + 8));
  bVar1 = xray_re::xr_file_system::file_exist((string *)((long)&folder.field_2 + 8));
  if (bVar1) {
    uVar5 = std::__cxx11::string::c_str();
    xray_re::msg("skipping %s (already exists)",uVar5);
  }
  else {
    std::__cxx11::string::string((string *)(dds_path.field_2._M_local_buf + 8));
    xray_re::xr_file_system::split_path
              ((string *)((long)&folder.field_2 + 8),(string *)(dds_path.field_2._M_local_buf + 8),
               (string *)0x0,(string *)0x0);
    xray_re::xr_file_system::create_path(this_00,(string *)((long)&dds_path.field_2 + 8));
    std::__cxx11::string::string((string *)&dds.m_data,(string *)path);
    std::__cxx11::string::replace
              ((ulong)&dds.m_data,thm.ext_normal_map_name.field_2._8_8_,(char *)0x4);
    xray_re::xr_image::xr_image((xr_image *)local_180);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = xray_re::xr_image::load_dds((xr_image *)local_180,"$game_textures$",pcVar4);
    if (bVar1) {
      uVar5 = std::__cxx11::string::c_str();
      xray_re::msg("saving %s",uVar5);
      xray_re::xr_image::save_tga((xr_image *)local_180,(string *)((long)&folder.field_2 + 8));
    }
    else {
      uVar5 = std::__cxx11::string::c_str();
      xray_re::msg("can\'t load %s",uVar5);
    }
    xray_re::xr_image::~xr_image((xr_image *)local_180);
    std::__cxx11::string::~string((string *)&dds.m_data);
    std::__cxx11::string::~string((string *)(dds_path.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)(folder.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(dest.field_2._M_local_buf + 8));
LAB_00126649:
  xray_re::xr_texture_thumbnail::~xr_texture_thumbnail((xr_texture_thumbnail *)local_d0);
  return;
}

Assistant:

void dds_tools::process_file(const std::string& path)
{
	std::string::size_type offs = path.size();
	if (offs < 4 || path.compare(offs -= 4, 4, ".thm") != 0)
		return;

	xr_texture_thumbnail thm;
	if (!thm.load(PA_GAME_TEXTURES, path.c_str())) {
		msg("can't load %s", path.c_str());
		return;
	}
	if (path.compare(0, 4, "lod\\") == 0) {
		msg("skipping %s (billboard)", path.c_str());
		return;
	}
	switch (thm.type) {
	case xr_texture_thumbnail::tt_image:
		if (m_with_solid || thm.has_alpha_channel() ||
				thm.is_implicitly_lighted()) {
			break;
		}
		msg("skipping %s (solid)", path.c_str());
		return;
	case xr_texture_thumbnail::tt_cube_map:
		msg("skipping %s (cube map)", path.c_str());
		return;
	case xr_texture_thumbnail::tt_bump_map:
		if (m_with_bump)
			break;
		msg("skipping %s (bump map)", path.c_str());
		return;
	case xr_texture_thumbnail::tt_normal_map:
	case xr_texture_thumbnail::tt_terrain:
		break;
	default:
		msg("skipping %s (unknown) %#x", path.c_str(), thm.type);
		return;
	}

	xr_file_system& fs = xr_file_system::instance();
	std::string tga_path(path);
	tga_path.replace(offs, 4, ".tga");
	std::string dest; fs.resolve_path(PA_TEXTURES, tga_path, dest);
	if (fs.file_exist(dest)) {
		msg("skipping %s (already exists)", path.c_str());
		return;
	}

	std::string folder; fs.split_path(dest, &folder, NULL, NULL);
	fs.create_path(folder);

	std::string dds_path(path);
	dds_path.replace(offs, 4, ".dds");
	xr_image dds;
	if (!dds.load_dds(PA_GAME_TEXTURES, dds_path.c_str())) {
		msg("can't load %s", dds_path.c_str());
		return;
	}
	msg("saving %s", tga_path.c_str());
	dds.save_tga(dest);
}